

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O1

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getStencilName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkStencilOpState *stencilOpState)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  string fullName;
  ostringstream name;
  undefined1 auStack_1f8 [8];
  string local_1f0;
  string local_1d0;
  long *local_1b0 [2];
  long local_1a0 [2];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"fail_",5);
  switch(*(undefined4 *)this) {
  case 0:
    pcVar3 = "keep";
    break;
  case 1:
    pcVar3 = "zero";
    break;
  case 2:
    pcVar3 = "repl";
    break;
  case 3:
    pcVar3 = "incc";
    break;
  case 4:
    pcVar3 = "decc";
    break;
  case 5:
    pcVar3 = "inv";
    break;
  case 6:
    pcVar3 = "wrap";
    break;
  case 7:
    pcVar3 = "decw";
    break;
  default:
    bVar1 = true;
    pcVar3 = (char *)0x0;
    goto LAB_00512142;
  }
  bVar1 = false;
LAB_00512142:
  if (bVar1) {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x68);
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar3,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_pass_",6);
  switch(*(undefined4 *)(this + 4)) {
  case 0:
    pcVar3 = "keep";
    break;
  case 1:
    pcVar3 = "zero";
    break;
  case 2:
    pcVar3 = "repl";
    break;
  case 3:
    pcVar3 = "incc";
    break;
  case 4:
    pcVar3 = "decc";
    break;
  case 5:
    pcVar3 = "inv";
    break;
  case 6:
    pcVar3 = "wrap";
    break;
  case 7:
    pcVar3 = "decw";
    break;
  default:
    bVar1 = true;
    pcVar3 = (char *)0x0;
    goto LAB_005121ff;
  }
  bVar1 = false;
LAB_005121ff:
  if (bVar1) {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x68);
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar3,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_dfail_",7);
  switch(*(undefined4 *)(this + 8)) {
  case 0:
    pcVar3 = "keep";
    break;
  case 1:
    pcVar3 = "zero";
    break;
  case 2:
    pcVar3 = "repl";
    break;
  case 3:
    pcVar3 = "incc";
    break;
  case 4:
    pcVar3 = "decc";
    break;
  case 5:
    pcVar3 = "inv";
    break;
  case 6:
    pcVar3 = "wrap";
    break;
  case 7:
    pcVar3 = "decw";
    break;
  default:
    bVar1 = true;
    pcVar3 = (char *)0x0;
    goto LAB_005122bc;
  }
  bVar1 = false;
LAB_005122bc:
  if (bVar1) {
    std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x68);
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar3,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_comp_",6);
  pcVar3 = ::vk::getCompareOpName(*(VkCompareOp *)(this + 0xc));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,pcVar3,(allocator<char> *)&local_1d0);
  std::__cxx11::string::substr((ulong)&local_1d0,(ulong)local_1b0);
  de::toLower(&local_1f0,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string getStencilName(const VkStencilOpState& stencilOpState)
{
	std::ostringstream name;

	name << "fail_" << getShortName(stencilOpState.failOp)
		 << "_pass_" << getShortName(stencilOpState.passOp)
		 << "_dfail_" << getShortName(stencilOpState.depthFailOp)
		 << "_comp_" << getShortName(stencilOpState.compareOp);

	return name.str();
}